

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

Vec_Wec_t * Abc_GiaSynthesize(Vec_Ptr_t *vGias)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Frame_t *pAVar5;
  Vec_Wec_t *p;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *vNode;
  int local_40;
  int iNode;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk;
  Vec_Wec_t *vRes;
  Vec_Ptr_t *vGias_local;
  
  pAVar4 = Abc_NtkCreateFromGias("top",vGias);
  vNode._4_4_ = 0;
  pAVar5 = Abc_FrameReadGlobalFrame();
  Abc_FrameReplaceCurrentNetwork(pAVar5,pAVar4);
  pAVar5 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar5,
                     "compress2rs; dch; map -a;  strash; compress2rs; dch; map -a;  strash; compress2rs; dch; map -a"
                    );
  pAVar5 = Abc_FrameReadGlobalFrame();
  pAVar4 = Abc_FrameReadNtk(pAVar5);
  iVar1 = Abc_NtkPiNum(pAVar4);
  iVar2 = Abc_NtkNodeNum(pAVar4);
  iVar3 = Abc_NtkPoNum(pAVar4);
  p = Vec_WecStart(iVar1 + iVar2 + iVar3);
  for (iNode = 0; iVar1 = Abc_NtkPiNum(pAVar4), iNode < iVar1; iNode = iNode + 1) {
    pAVar6 = Abc_NtkPi(pAVar4,iNode);
    (pAVar6->field_6).iTemp = vNode._4_4_;
    vNode._4_4_ = vNode._4_4_ + 1;
  }
  for (iNode = 0; iVar1 = Vec_PtrSize(pAVar4->vObjs), iNode < iVar1; iNode = iNode + 1) {
    pAVar6 = Abc_NtkObj(pAVar4,iNode);
    if ((pAVar6 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar6), iVar1 != 0)) {
      pVVar8 = Vec_WecEntry(p,vNode._4_4_);
      iVar1 = Abc_GateToType(pAVar6);
      Vec_IntPush(pVVar8,iVar1);
      Vec_IntPush(pVVar8,vNode._4_4_);
      for (local_40 = 0; iVar1 = Abc_ObjFaninNum(pAVar6), local_40 < iVar1; local_40 = local_40 + 1)
      {
        pAVar7 = Abc_ObjFanin(pAVar6,local_40);
        Vec_IntPush(pVVar8,(pAVar7->field_6).iTemp);
      }
      (pAVar6->field_6).iTemp = vNode._4_4_;
      vNode._4_4_ = vNode._4_4_ + 1;
    }
  }
  for (iNode = 0; iVar1 = Abc_NtkPoNum(pAVar4), iNode < iVar1; iNode = iNode + 1) {
    pAVar6 = Abc_NtkPo(pAVar4,iNode);
    pVVar8 = Vec_WecEntry(p,vNode._4_4_);
    pAVar6 = Abc_ObjFanin0(pAVar6);
    Vec_IntPushTwo(pVVar8,0xb,(pAVar6->field_6).iTemp);
    vNode._4_4_ = vNode._4_4_ + 1;
  }
  iVar1 = Vec_WecSize(p);
  if (iVar1 == vNode._4_4_) {
    return p;
  }
  __assert_fail("Vec_WecSize(vRes) == iNode",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcUtil.c"
                ,0xc60,"Vec_Wec_t *Abc_GiaSynthesize(Vec_Ptr_t *)");
}

Assistant:

Vec_Wec_t * Abc_GiaSynthesize( Vec_Ptr_t * vGias )
{
    Vec_Wec_t * vRes = NULL;
    Abc_Ntk_t * pNtk = Abc_NtkCreateFromGias( "top", vGias );
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, iNode = 0;
    Abc_FrameReplaceCurrentNetwork( Abc_FrameReadGlobalFrame(), pNtk );
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "compress2rs; dch; map -a;  strash; compress2rs; dch; map -a;  strash; compress2rs; dch; map -a" );
    pNtkNew = Abc_FrameReadNtk( Abc_FrameReadGlobalFrame() );
    vRes = Vec_WecStart( Abc_NtkPiNum(pNtkNew) + Abc_NtkNodeNum(pNtkNew) + Abc_NtkPoNum(pNtkNew) );
    Abc_NtkForEachPi( pNtkNew, pObj, i )
        pObj->iTemp = iNode++;
    Abc_NtkForEachNode( pNtkNew, pObj, i )
    {
        Vec_Int_t * vNode = Vec_WecEntry(vRes, iNode);
        Vec_IntPush( vNode, Abc_GateToType(pObj) );
        Vec_IntPush( vNode, iNode );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vNode, pFanin->iTemp );
        pObj->iTemp = iNode++;
    }
    Abc_NtkForEachPo( pNtkNew, pObj, i )
        Vec_IntPushTwo( Vec_WecEntry(vRes, iNode++), ABC_OPER_BIT_BUF, Abc_ObjFanin0(pObj)->iTemp );
    assert( Vec_WecSize(vRes) == iNode );
    return vRes;
}